

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidBatchnorm(void)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  BatchnormLayerParams *this_01;
  WeightParams *pWVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  int iVar9;
  bool bVar10;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",puVar8);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,1);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"probs",puVar8);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m1);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_batchnorm(this_00);
  this_01->channels_ = 5;
  iVar9 = 5;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    pWVar6 = CoreML::Specification::BatchnormLayerParams::_internal_mutable_beta(this_01);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar6,1.0);
    pWVar6 = CoreML::Specification::BatchnormLayerParams::_internal_mutable_gamma(this_01);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar6,1.0);
  }
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar10 = CoreML::Result::good(&res);
  if (bVar10) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb28);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar10;
}

Assistant:

int testInvalidBatchnorm() {

    Specification::Model m1;

    int num_inputs = 5;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *batchnormLayer = nn->add_layers();
    batchnormLayer->add_input("input");
    batchnormLayer->add_output("probs");
    auto *params = batchnormLayer->mutable_batchnorm();
    params->set_channels(num_inputs);

    for (int i = 0; i < num_inputs; i++) {
        params->mutable_beta()->add_floatvalue(1.0);
        params->mutable_gamma()->add_floatvalue(1.0);
    }
    // Invalid because the mean and variance should be provided

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}